

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>_>
::get_zero_apparent_cofacet
          (optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>_>
          *this,diameter_entry_t simplex,dimension_t dim)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  bool bVar7;
  pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
  *ppVar8;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  *this_00;
  simplex_t *psVar9;
  simplex_t *psVar10;
  diameter_entry_t *__t;
  diameter_entry_t *p;
  diameter_entry_t *p_00;
  undefined8 extraout_RDX;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  byte bVar24;
  char local_128;
  char cStack_127;
  char cStack_126;
  char cStack_125;
  char cStack_124;
  char cStack_123;
  char cStack_122;
  char cStack_121;
  char cStack_120;
  char cStack_11f;
  char cStack_11e;
  char cStack_11d;
  char cStack_11c;
  char cStack_11b;
  char cStack_11a;
  char cStack_119;
  char local_e8;
  char cStack_e7;
  char cStack_e6;
  char cStack_e5;
  char cStack_e4;
  char cStack_e3;
  char cStack_e2;
  char cStack_e1;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  char cStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  char cStack_d9;
  undefined1 local_a8 [8];
  optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
  facet;
  undefined1 local_48 [8];
  optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
  cofacet;
  dimension_t dim_local;
  Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>_>
  *this_local;
  
  cofacet.
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
  ._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
  ._47_1_ = dim;
  get_zero_pivot_cofacet
            ((optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
              *)local_48,this,simplex,dim);
  bVar7 = std::optional::operator_cast_to_bool((optional *)local_48);
  if (bVar7) {
    ppVar8 = &std::
              optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
              ::operator*((optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                           *)local_48)->
              super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
    ;
    get_zero_pivot_facet
              ((optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                *)local_a8,this,(diameter_entry_t)*ppVar8,
               cofacet.
               super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
               ._M_payload.
               super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
               ._47_1_ + '\x01');
    bVar7 = std::optional::operator_cast_to_bool((optional *)local_a8);
    if (bVar7) {
      this_00 = (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
                 *)std::
                   optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                   ::operator*((optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                                *)local_a8);
      psVar9 = Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
               ::get_index((simplex_t *)this,this_00,p);
      psVar10 = Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
                ::get_index((simplex_t *)this,
                            (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
                             *)&simplex,p_00);
      local_128 = (char)psVar9;
      cStack_127 = (char)((ulong)psVar9 >> 8);
      cStack_126 = (char)((ulong)psVar9 >> 0x10);
      cStack_125 = (char)((ulong)psVar9 >> 0x18);
      cStack_124 = (char)((ulong)psVar9 >> 0x20);
      cStack_123 = (char)((ulong)psVar9 >> 0x28);
      cStack_122 = (char)((ulong)psVar9 >> 0x30);
      cStack_121 = (char)((ulong)psVar9 >> 0x38);
      cStack_120 = (char)p_00;
      cStack_11f = (char)((ulong)p_00 >> 8);
      cStack_11e = (char)((ulong)p_00 >> 0x10);
      cStack_11d = (char)((ulong)p_00 >> 0x18);
      cStack_11c = (char)((ulong)p_00 >> 0x20);
      cStack_11b = (char)((ulong)p_00 >> 0x28);
      cStack_11a = (char)((ulong)p_00 >> 0x30);
      cStack_119 = (char)((ulong)p_00 >> 0x38);
      local_e8 = (char)psVar10;
      cStack_e7 = (char)((ulong)psVar10 >> 8);
      cStack_e6 = (char)((ulong)psVar10 >> 0x10);
      cStack_e5 = (char)((ulong)psVar10 >> 0x18);
      cStack_e4 = (char)((ulong)psVar10 >> 0x20);
      cStack_e3 = (char)((ulong)psVar10 >> 0x28);
      cStack_e2 = (char)((ulong)psVar10 >> 0x30);
      cStack_e1 = (char)((ulong)psVar10 >> 0x38);
      cStack_e0 = (char)extraout_RDX;
      cStack_df = (char)((ulong)extraout_RDX >> 8);
      cStack_de = (char)((ulong)extraout_RDX >> 0x10);
      cStack_dd = (char)((ulong)extraout_RDX >> 0x18);
      cStack_dc = (char)((ulong)extraout_RDX >> 0x20);
      cStack_db = (char)((ulong)extraout_RDX >> 0x28);
      cStack_da = (char)((ulong)extraout_RDX >> 0x30);
      cStack_d9 = (char)((ulong)extraout_RDX >> 0x38);
      cVar11 = -(cStack_126 == cStack_e6);
      cVar12 = -(cStack_125 == cStack_e5);
      cVar13 = -(cStack_124 == cStack_e4);
      cVar14 = -(cStack_123 == cStack_e3);
      cVar15 = -(cStack_122 == cStack_e2);
      cVar16 = -(cStack_121 == cStack_e1);
      cVar17 = -(cStack_120 == cStack_e0);
      cVar18 = -(cStack_11f == cStack_df);
      cVar19 = -(cStack_11e == cStack_de);
      cVar20 = -(cStack_11d == cStack_dd);
      cVar21 = -(cStack_11c == cStack_dc);
      cVar22 = -(cStack_11b == cStack_db);
      cVar23 = -(cStack_11a == cStack_da);
      bVar24 = -(cStack_119 == cStack_d9);
      auVar1[1] = -(cStack_127 == cStack_e7);
      auVar1[0] = -(local_128 == local_e8);
      auVar1[2] = cVar11;
      auVar1[3] = cVar12;
      auVar1[4] = cVar13;
      auVar1[5] = cVar14;
      auVar1[6] = cVar15;
      auVar1[7] = cVar16;
      auVar1[8] = cVar17;
      auVar1[9] = cVar18;
      auVar1[10] = cVar19;
      auVar1[0xb] = cVar20;
      auVar1[0xc] = cVar21;
      auVar1[0xd] = cVar22;
      auVar1[0xe] = cVar23;
      auVar1[0xf] = bVar24;
      auVar2[1] = -(cStack_127 == cStack_e7);
      auVar2[0] = -(local_128 == local_e8);
      auVar2[2] = cVar11;
      auVar2[3] = cVar12;
      auVar2[4] = cVar13;
      auVar2[5] = cVar14;
      auVar2[6] = cVar15;
      auVar2[7] = cVar16;
      auVar2[8] = cVar17;
      auVar2[9] = cVar18;
      auVar2[10] = cVar19;
      auVar2[0xb] = cVar20;
      auVar2[0xc] = cVar21;
      auVar2[0xd] = cVar22;
      auVar2[0xe] = cVar23;
      auVar2[0xf] = bVar24;
      auVar6[1] = cVar12;
      auVar6[0] = cVar11;
      auVar6[2] = cVar13;
      auVar6[3] = cVar14;
      auVar6[4] = cVar15;
      auVar6[5] = cVar16;
      auVar6[6] = cVar17;
      auVar6[7] = cVar18;
      auVar6[8] = cVar19;
      auVar6[9] = cVar20;
      auVar6[10] = cVar21;
      auVar6[0xb] = cVar22;
      auVar6[0xc] = cVar23;
      auVar6[0xd] = bVar24;
      auVar5[1] = cVar13;
      auVar5[0] = cVar12;
      auVar5[2] = cVar14;
      auVar5[3] = cVar15;
      auVar5[4] = cVar16;
      auVar5[5] = cVar17;
      auVar5[6] = cVar18;
      auVar5[7] = cVar19;
      auVar5[8] = cVar20;
      auVar5[9] = cVar21;
      auVar5[10] = cVar22;
      auVar5[0xb] = cVar23;
      auVar5[0xc] = bVar24;
      auVar4[1] = cVar14;
      auVar4[0] = cVar13;
      auVar4[2] = cVar15;
      auVar4[3] = cVar16;
      auVar4[4] = cVar17;
      auVar4[5] = cVar18;
      auVar4[6] = cVar19;
      auVar4[7] = cVar20;
      auVar4[8] = cVar21;
      auVar4[9] = cVar22;
      auVar4[10] = cVar23;
      auVar4[0xb] = bVar24;
      auVar3[1] = cVar15;
      auVar3[0] = cVar14;
      auVar3[2] = cVar16;
      auVar3[3] = cVar17;
      auVar3[4] = cVar18;
      auVar3[5] = cVar19;
      auVar3[6] = cVar20;
      auVar3[7] = cVar21;
      auVar3[8] = cVar22;
      auVar3[9] = cVar23;
      auVar3[10] = bVar24;
      if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar24,CONCAT18(cVar23,CONCAT17(cVar22,CONCAT16(cVar21,
                                                  CONCAT15(cVar20,CONCAT14(cVar19,CONCAT13(cVar18,
                                                  CONCAT12(cVar17,CONCAT11(cVar16,cVar15))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar24,CONCAT17(cVar23,CONCAT16(cVar22,CONCAT15(cVar21,
                                                  CONCAT14(cVar20,CONCAT13(cVar19,CONCAT12(cVar18,
                                                  CONCAT11(cVar17,cVar16)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar24 >> 7) << 0xf) == 0xffff) {
        __t = std::
              optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
              ::operator*((optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                           *)local_48);
        std::
        optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
        ::
        optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t_&,_true>
                  (__return_storage_ptr__,__t);
        return __return_storage_ptr__;
      }
    }
    std::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
    ::optional(__return_storage_ptr__);
  }
  else {
    std::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
    ::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> get_zero_apparent_cofacet(const diameter_entry_t simplex, const dimension_t dim) {
    std::optional<diameter_entry_t> cofacet = get_zero_pivot_cofacet(simplex, dim);
    if (!cofacet) return std::nullopt;
    std::optional<diameter_entry_t> facet = get_zero_pivot_facet(*cofacet, dim + 1);
    if (!facet || filt.get_index(*facet) != filt.get_index(simplex)) return std::nullopt;
    return *cofacet;
  }